

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

void luaF_freeproto(lua_State *L,Proto *f)

{
  size_t in_RSI;
  void *in_RDI;
  lua_State *unaff_retaddr;
  size_t in_stack_ffffffffffffffe8;
  
  luaM_realloc_(unaff_retaddr,in_RDI,in_RSI,in_stack_ffffffffffffffe8);
  luaM_realloc_(unaff_retaddr,in_RDI,in_RSI,in_stack_ffffffffffffffe8);
  luaM_realloc_(unaff_retaddr,in_RDI,in_RSI,in_stack_ffffffffffffffe8);
  luaM_realloc_(unaff_retaddr,in_RDI,in_RSI,in_stack_ffffffffffffffe8);
  luaM_realloc_(unaff_retaddr,in_RDI,in_RSI,in_stack_ffffffffffffffe8);
  luaM_realloc_(unaff_retaddr,in_RDI,in_RSI,in_stack_ffffffffffffffe8);
  luaM_realloc_(unaff_retaddr,in_RDI,in_RSI,in_stack_ffffffffffffffe8);
  return;
}

Assistant:

static void luaF_freeproto(lua_State*L,Proto*f){
luaM_freearray(L,f->code,f->sizecode,Instruction);
luaM_freearray(L,f->p,f->sizep,Proto*);
luaM_freearray(L,f->k,f->sizek,TValue);
luaM_freearray(L,f->lineinfo,f->sizelineinfo,int);
luaM_freearray(L,f->locvars,f->sizelocvars,struct LocVar);
luaM_freearray(L,f->upvalues,f->sizeupvalues,TString*);
luaM_free(L,f);
}